

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O1

void __thiscall OpenMD::FragmentStamp::checkInversions(FragmentStamp *this)

{
  int iVar1;
  int iVar2;
  _Head_base<3UL,_int,_false> _Var3;
  InversionStamp *pIVar4;
  long lVar5;
  pointer piVar6;
  pointer pcVar7;
  const_iterator __position;
  void *pvVar8;
  size_type sVar9;
  _Head_base<2UL,_int,_false> _Var10;
  bool bVar11;
  int __tmp_1;
  pointer ppBVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  _Alloc_hider _Var15;
  pointer ppIVar16;
  iterator iVar17;
  ostream *poVar18;
  OpenMDException *pOVar19;
  int __tmp;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  vector<int,_std::allocator<int>_> satellites;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allInversions;
  int b;
  tuple<int,_int,_int,_int> inversionTuple;
  vector<int,_std::allocator<int>_> inversion;
  ostringstream oss;
  string local_248;
  undefined1 local_220 [32];
  _Base_ptr local_200;
  size_t local_1f8;
  string local_1f0;
  key_type local_1d0;
  vector<int,_std::allocator<int>_> local_1c0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppIVar16 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->inversionStamps_).
      super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar16) {
    uVar21 = 0;
    do {
      pIVar4 = ppIVar16[(int)uVar21];
      iVar1 = pIVar4->center_;
      local_248._M_dataplus._M_p = (pointer)0x0;
      local_248._M_string_length = 0;
      local_248.field_2._M_allocated_capacity = 0;
      if ((long)(pIVar4->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pIVar4->satellites_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0xc) {
        ppBVar12 = (this->bondStamps_).
                   super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        if ((this->bondStamps_).
            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppBVar12) {
          lVar22 = 0;
          uVar20 = 0;
          do {
            lVar5 = *(long *)((long)ppBVar12 + (lVar22 >> 0x1d));
            iVar2 = *(int *)(lVar5 + 0xa0);
            local_220._0_4_ = iVar2;
            local_1f0._M_dataplus._M_p._0_4_ = *(int *)(lVar5 + 0xa4);
            if (iVar2 == iVar1) {
              if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_248,
                           (iterator)local_248._M_string_length,(int *)&local_1f0);
              }
              else {
                *(int *)local_248._M_string_length = (int)local_1f0._M_dataplus._M_p;
                local_248._M_string_length = local_248._M_string_length + 4;
              }
            }
            if ((int)local_1f0._M_dataplus._M_p == iVar1) {
              if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_248,
                           (iterator)local_248._M_string_length,(int *)local_220);
              }
              else {
                *(undefined4 *)local_248._M_string_length = local_220._0_4_;
                local_248._M_string_length = local_248._M_string_length + 4;
              }
            }
            uVar20 = uVar20 + 1;
            ppBVar12 = (this->bondStamps_).
                       super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            lVar22 = lVar22 + 0x100000000;
          } while (uVar20 < (ulong)((long)(this->bondStamps_).
                                          super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppBVar12 >> 3));
        }
        sVar9 = local_248._M_string_length;
        _Var15._M_p = local_248._M_dataplus._M_p;
        if (local_248._M_string_length - (long)local_248._M_dataplus._M_p != 0xc) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error in Fragment ",0x12);
          pcVar7 = (this->Name).data_._M_dataplus._M_p;
          local_220._0_8_ = local_220 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_220,pcVar7,pcVar7 + (this->Name).data_._M_string_length);
          poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar18,": found wrong number",0x14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar18," of bonds for inversion center ",0x1f);
          std::ostream::operator<<(poVar18,iVar1);
          if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
            operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
          }
          pOVar19 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar19,(string *)local_220);
          __cxa_throw(pOVar19,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        if (local_248._M_dataplus._M_p != (pointer)local_248._M_string_length) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_248._M_dataplus._M_p,local_248._M_string_length,2);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (_Var15._M_p,sVar9);
        }
        InversionStamp::setSatellites(pIVar4,(vector<int,_std::allocator<int>_> *)&local_248);
      }
      if ((int *)local_248._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_248._M_dataplus._M_p,
                        local_248.field_2._M_allocated_capacity - (long)local_248._M_dataplus._M_p);
      }
      uVar21 = uVar21 + 1;
      ppIVar16 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->inversionStamps_).
                                    super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 >> 3
                             ));
  }
  ppIVar16 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->inversionStamps_).
      super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar16) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      lVar5 = *(long *)((long)ppIVar16 + (lVar22 >> 0x1d));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f0,
                 (vector<int,_std::allocator<int>_> *)(lVar5 + 0xa0));
      __position._M_current._4_4_ = local_1f0._M_dataplus._M_p._4_4_;
      __position._M_current._0_4_ = (int)local_1f0._M_dataplus._M_p;
      local_220._0_4_ = *(undefined4 *)(lVar5 + 0x98);
      std::vector<int,_std::allocator<int>_>::_M_insert_rval
                ((vector<int,_std::allocator<int>_> *)&local_1f0,__position,
                 (value_type_conflict1 *)local_220);
      local_220._8_8_ =
           ((long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->atomStamps_).
                  super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>>
                         (CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p)
                          ,local_1f0._M_string_length,local_220);
      local_220._0_8_ = (pointer)0x0;
      _Var14 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_pred<std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>>
                         (CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p)
                          ,local_1f0._M_string_length,local_220);
      if ((_Var13._M_current != (int *)local_1f0._M_string_length) ||
         (_Var14._M_current != (int *)local_1f0._M_string_length)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar7 = (this->Name).data_._M_dataplus._M_p;
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_220,pcVar7,pcVar7 + (this->Name).data_._M_string_length);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,": atoms of inversion",0x14);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_248,(OpenMD *)&local_1f0,cont);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," have invalid indices\n",0x16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        pOVar19 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar19,(string *)local_220);
        __cxa_throw(pOVar19,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      bVar11 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                         ((vector<int,_std::allocator<int>_> *)&local_1f0);
      if (bVar11) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar7 = (this->Name).data_._M_dataplus._M_p;
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_220,pcVar7,pcVar7 + (this->Name).data_._M_string_length);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," : atoms of inversion",0x15);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_248,(OpenMD *)&local_1f0,cont_00);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,local_248._M_dataplus._M_p,local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18," have duplicated indices\n",0x19);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        pOVar19 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar19,(string *)local_220);
        __cxa_throw(pOVar19,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      pvVar8 = (void *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,local_1f0.field_2._M_allocated_capacity - (long)pvVar8);
      }
      uVar21 = uVar21 + 1;
      ppIVar16 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x100000000;
    } while (uVar21 < (ulong)((long)(this->inversionStamps_).
                                    super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 >> 3
                             ));
  }
  ppIVar16 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->inversionStamps_).
      super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar16) {
    uVar21 = 0;
    do {
      pIVar4 = ppIVar16[(int)uVar21];
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_248,&pIVar4->satellites_);
      if (local_248._M_string_length == local_248.field_2._M_allocated_capacity) {
        local_220._0_4_ = pIVar4->center_;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)&local_248,
                   (iterator)local_248._M_string_length,(int *)local_220);
      }
      else {
        *(int *)local_248._M_string_length = pIVar4->center_;
        local_248._M_string_length = local_248._M_string_length + 4;
      }
      local_220._0_8_ = (ulong)(uint)local_220._4_4_ << 0x20;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1f0,
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->rigidBodyStamps_).
                       super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_220,(allocator_type *)&local_1c0);
      if (local_248._M_dataplus._M_p != (pointer)local_248._M_string_length) {
        piVar6 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var15._M_p = local_248._M_dataplus._M_p;
        do {
          iVar1 = piVar6[*(int *)_Var15._M_p];
          lVar22 = (long)iVar1;
          if ((-1 < lVar22) &&
             (iVar2 = *(int *)(CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                        (int)local_1f0._M_dataplus._M_p) + lVar22 * 4),
             *(int *)(CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p) +
                     lVar22 * 4) = iVar2 + 1, 2 < iVar2)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Error in Fragment ",0x12);
            pcVar7 = (this->Name).data_._M_dataplus._M_p;
            local_220._0_8_ = local_220 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_220,pcVar7,pcVar7 + (this->Name).data_._M_string_length);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_220._0_8_,local_220._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18,": inversion centered on atom ",0x1d);
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,pIVar4->center_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar18," has four atoms that belong to same rigidbody ",0x2e);
            poVar18 = (ostream *)std::ostream::operator<<(poVar18,iVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
            if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
              operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
            }
            pOVar19 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar19,(string *)local_220);
            __cxa_throw(pOVar19,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
          _Var15._M_p = _Var15._M_p + 4;
        } while (_Var15._M_p != (pointer)local_248._M_string_length);
      }
      pvVar8 = (void *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p);
      if (pvVar8 != (void *)0x0) {
        operator_delete(pvVar8,local_1f0.field_2._M_allocated_capacity - (long)pvVar8);
      }
      if ((int *)local_248._M_dataplus._M_p != (int *)0x0) {
        operator_delete(local_248._M_dataplus._M_p,
                        local_248.field_2._M_allocated_capacity - (long)local_248._M_dataplus._M_p);
      }
      uVar21 = uVar21 + 1;
      ppIVar16 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar21 < (ulong)((long)(this->inversionStamps_).
                                    super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 >> 3
                             ));
  }
  local_220._24_8_ = local_220 + 8;
  local_220._8_8_ = local_220._8_8_ & 0xffffffff00000000;
  local_220._16_8_ = (_Base_ptr)0x0;
  local_1f8 = 0;
  ppIVar16 = (this->inversionStamps_).
             super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  local_200 = (_Base_ptr)local_220._24_8_;
  if ((this->inversionStamps_).
      super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar16) {
    lVar22 = 0;
    uVar21 = 0;
    do {
      lVar5 = *(long *)((long)ppIVar16 + (lVar22 >> 0x1d));
      iVar1 = *(int *)(lVar5 + 0x98);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_1c0,(vector<int,_std::allocator<int>_> *)(lVar5 + 0xa0));
      _Var3._M_head_impl =
           local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
      local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
      super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
           local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
      iVar2 = *local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
      super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>
      ._M_head_impl = (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var3._M_head_impl;
      if (_Var3._M_head_impl <
          local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
          .super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl) {
        local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)
             (_Head_base<3UL,_int,_false>)
             local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
             super__Head_base<2UL,_int,_false>._M_head_impl;
        local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             _Var3._M_head_impl;
      }
      local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
      super__Head_base<1UL,_int,_false>._M_head_impl = iVar2;
      if (local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
          .super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl < iVar2)
      {
        local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.
             super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
             super__Head_base<2UL,_int,_false>._M_head_impl;
        local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = iVar2;
      }
      _Var10._M_head_impl =
           local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.
           super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
           super__Head_base<2UL,_int,_false>._M_head_impl;
      if ((int)local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.
               super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
               super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl <
          local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>
          .super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl) {
        local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             (int)local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.
                  super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
                  super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl;
        local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
        super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)_Var10._M_head_impl;
      }
      local_1d0.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
      _M_head_impl = iVar1;
      iVar17 = std::
               _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                       *)local_220,&local_1d0);
      if (iVar17._M_node != (_Base_ptr)(local_220 + 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error in Fragment ",0x12);
        pcVar7 = (this->Name).data_._M_dataplus._M_p;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,pcVar7,pcVar7 + (this->Name).data_._M_string_length);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_248._M_dataplus._M_p,
                             local_248._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"Inversion",9);
        containerToString<std::vector<int,std::allocator<int>>>
                  (&local_1f0,(OpenMD *)&local_1c0,cont_01);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(char *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,
                                                      (int)local_1f0._M_dataplus._M_p),
                             local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18," appears multiple times\n",0x18)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p) !=
            &local_1f0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1f0._M_dataplus._M_p._4_4_,(int)local_1f0._M_dataplus._M_p)
                          ,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        pOVar19 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar19,&local_248);
        __cxa_throw(pOVar19,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      std::
      _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
      ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                  *)local_220,&local_1d0);
      if (local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar21 = uVar21 + 1;
      ppIVar16 = (this->inversionStamps_).
                 super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x100000000;
    } while (uVar21 < (ulong)((long)(this->inversionStamps_).
                                    super__Vector_base<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar16 >> 3
                             ));
  }
  std::
  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
               *)local_220);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FragmentStamp::checkInversions() {
    std::ostringstream oss;

    // first we automatically find the other three atoms that
    // are satellites of an inversion center:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int center                     = inversionStamp->getCenter();
      std::vector<int> satellites;

      // Some inversions come pre-programmed with the satellites.  If
      // so, don't add the satellites as they are already there.

      if (inversionStamp->getNSatellites() != 3) {
        for (std::size_t j = 0; j < getNBonds(); ++j) {
          BondStamp* bondStamp = getBondStamp(j);
          int a                = bondStamp->getA();
          int b                = bondStamp->getB();

          if (a == center) { satellites.push_back(b); }
          if (b == center) { satellites.push_back(a); }
        }

        if (satellites.size() == 3) {
          std::sort(satellites.begin(), satellites.end());
          inversionStamp->setSatellites(satellites);
        } else {
          oss << "Error in Fragment " << getName() << ": found wrong number"
              << " of bonds for inversion center " << center;
          throw OpenMDException(oss.str());
        }
      }
    }

    // then we do some sanity checking on the inversions:

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);

      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      // add the central atom to the beginning of the list:
      inversionAtoms.insert(inversionAtoms.begin(),
                            inversionStamp->getCenter());

      std::vector<int>::iterator j = std::find_if(
          inversionAtoms.begin(), inversionAtoms.end(),
          std::bind(std::greater<int>(), placeholders::_1, getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(inversionAtoms.begin(), inversionAtoms.end(),
                       std::bind(std::less<int>(), placeholders::_1, 0));

      if (j != inversionAtoms.end() || k != inversionAtoms.end()) {
        oss << "Error in Fragment " << getName() << ": atoms of inversion"
            << containerToString(inversionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(inversionAtoms)) {
        oss << "Error in Fragment " << getName() << " : atoms of inversion"
            << containerToString(inversionAtoms)
            << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp  = getInversionStamp(i);
      std::vector<int> inversionAtoms = inversionStamp->getSatellites();
      inversionAtoms.push_back(inversionStamp->getCenter());
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = inversionAtoms.begin(); j != inversionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Fragment " << getName()
                << ": inversion centered on atom "
                << inversionStamp->getCenter()
                << " has four atoms that belong to same rigidbody "
                << rigidbodyIndex << "\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allInversions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;
    for (std::size_t i = 0; i < getNInversions(); ++i) {
      InversionStamp* inversionStamp = getInversionStamp(i);
      int cent                       = inversionStamp->getCenter();
      std::vector<int> inversion     = inversionStamp->getSatellites();

      std::tuple<int, int, int, int> inversionTuple(cent, inversion[0],
                                                    inversion[1], inversion[2]);
      auto& [first, second, third, fourth] = inversionTuple;

      // In OpenMD, the Central atom in an inversion comes first, and
      // has a special position.  The other three atoms can come in
      // random order, and should be sorted in increasing numerical
      // order to check for duplicates.  This requires three pairwise
      // swaps:
      if (third > fourth) std::swap(third, fourth);
      if (second > third) std::swap(second, third);
      if (third > fourth) std::swap(third, fourth);

      iter = allInversions.find(inversionTuple);
      if (iter == allInversions.end()) {
        allInversions.insert(inversionTuple);
      } else {
        oss << "Error in Fragment " << getName() << ": "
            << "Inversion" << containerToString(inversion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }
  }